

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::houghTransform<float>(void)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  pointer pPVar6;
  float fVar7;
  double dVar8;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOffLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOnLine;
  float y;
  float x;
  iterator p;
  float cosVal;
  float sinVal;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> point;
  float noiseValue;
  float lineTolerance;
  float angleStep;
  float angleTolerance;
  float angle;
  uint32_t i;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *in_stack_ffffffffffffff08;
  __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
  *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
  local_a0 [3];
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_88;
  float local_70;
  float local_6c;
  PointBase2D<float> *local_68;
  __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
  local_60;
  float local_54;
  float local_50;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar2 = local_8, uVar4 = Test_Helper::runCount(), uVar2 < uVar4;
      local_8 = local_8 + 1) {
    fVar7 = Unit_Test::randomFloatValue<float>
                      (SUB84(in_stack_ffffffffffffff10,0),
                       (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                       SUB84(in_stack_ffffffffffffff08,0));
    dVar8 = toRadians((double)fVar7);
    local_c = (float)dVar8;
    fVar7 = Unit_Test::randomFloatValue<float>
                      (SUB84(in_stack_ffffffffffffff10,0),
                       (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                       SUB84(in_stack_ffffffffffffff08,0));
    dVar8 = toRadians((double)(fVar7 + 0.1));
    local_10 = (float)dVar8;
    iVar5 = Test_Helper::randomValue<int>
                      ((int)in_stack_ffffffffffffff10,
                       (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_14 = (float)dVar8 / (float)iVar5;
    local_18 = Unit_Test::randomFloatValue<float>
                         (SUB84(in_stack_ffffffffffffff10,0),
                          (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                          SUB84(in_stack_ffffffffffffff08,0));
    local_1c = local_18 * 0.5;
    Test_Helper::randomValue<unsigned_int>
              ((uint)in_stack_ffffffffffffff10,(uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20))
    ;
    std::allocator<PointBase2D<float>_>::allocator((allocator<PointBase2D<float>_> *)0x24ab90);
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::allocator<PointBase2D<float>_>::~allocator((allocator<PointBase2D<float>_> *)0x24abb6);
    dVar8 = std::sin((double)(ulong)(uint)local_c);
    local_50 = SUB84(dVar8,0);
    dVar8 = std::cos((double)(ulong)(uint)local_c);
    in_stack_ffffffffffffff34 = SUB84(dVar8,0);
    local_54 = in_stack_ffffffffffffff34;
    local_60._M_current =
         (PointBase2D<float> *)
         std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::begin
                   (in_stack_ffffffffffffff08);
    while( true ) {
      local_68 = (PointBase2D<float> *)
                 std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::end
                           (in_stack_ffffffffffffff08);
      bVar3 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff10,
                         (__normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar3) break;
      in_stack_ffffffffffffff30 =
           Unit_Test::randomFloatValue<float>
                     (SUB84(in_stack_ffffffffffffff10,0),
                      (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                      SUB84(in_stack_ffffffffffffff08,0));
      in_stack_ffffffffffffff2c =
           Unit_Test::randomFloatValue<float>
                     (SUB84(in_stack_ffffffffffffff10,0),
                      (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                      SUB84(in_stack_ffffffffffffff08,0));
      local_6c = in_stack_ffffffffffffff30 + in_stack_ffffffffffffff2c;
      in_stack_ffffffffffffff28 =
           Unit_Test::randomFloatValue<float>
                     (SUB84(in_stack_ffffffffffffff10,0),
                      (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                      SUB84(in_stack_ffffffffffffff08,0));
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_54),ZEXT416((uint)local_6c),
                               ZEXT416((uint)-(in_stack_ffffffffffffff28 * local_50)));
      in_stack_ffffffffffffff20 = auVar1._0_4_;
      local_70 = in_stack_ffffffffffffff28;
      pPVar6 = __gnu_cxx::
               __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
               ::operator->(&local_60);
      pPVar6->x = in_stack_ffffffffffffff20;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_50),ZEXT416((uint)local_6c),
                               ZEXT416((uint)(local_70 * local_54)));
      in_stack_ffffffffffffff24 = auVar1._0_4_;
      pPVar6 = __gnu_cxx::
               __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
               ::operator->(&local_60);
      pPVar6->y = in_stack_ffffffffffffff24;
      __gnu_cxx::
      __normal_iterator<PointBase2D<float>_*,_std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>_>
      ::operator++(&local_60);
    }
    in_stack_ffffffffffffff08 = &local_88;
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)0x24adf4);
    in_stack_ffffffffffffff10 = local_a0;
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)0x24ae03);
    bVar3 = Image_Function::HoughTransform
                      ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                       (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       SUB84(in_stack_ffffffffffffff10,0),in_stack_ffffffffffffff08,
                       (vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)0x24ae3d)
    ;
    in_stack_ffffffffffffff1c = (float)CONCAT13(bVar3,SUB43(in_stack_ffffffffffffff1c,0));
    if ((bVar3) &&
       (bVar3 = std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::empty
                          ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)), bVar3)) {
      bVar3 = false;
    }
    else {
      local_1 = 0;
      bVar3 = true;
    }
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar3) goto LAB_0024aefb;
  }
  local_1 = 1;
LAB_0024aefb:
  return (bool)(local_1 & 1);
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }